

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O0

bool __thiscall
TOICompactRewardDecPOMDPDiscrete::SetInitialized(TOICompactRewardDecPOMDPDiscrete *this,bool b)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  E *this_00;
  char *arg;
  char *pcVar5;
  reference ppRVar6;
  undefined8 uVar7;
  DecPOMDPDiscrete *pDVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  MultiAgentDecisionProcessDiscrete *pMVar13;
  reference pvVar14;
  value_type vVar15;
  byte in_SIL;
  long *in_RDI;
  Index i_2;
  uint i_1;
  size_t nrStates;
  uint i;
  Index in_stack_ffffffffffffff7c;
  TOIDecPOMDPDiscrete *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  TOIDecPOMDPDiscrete *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa8;
  E *in_stack_ffffffffffffffb0;
  uint local_38;
  uint local_34;
  uint local_28;
  bool local_1;
  
  bVar1 = in_SIL & 1;
  if (bVar1 == 0) {
    *(undefined1 *)(in_RDI + 0x57) = 0;
    local_1 = true;
  }
  else {
    bVar2 = TOIDecPOMDPDiscrete::SetInitialized
                      (in_stack_ffffffffffffff98,SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
    if (bVar2) {
      if (bVar1 == 1) {
        sVar3 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::size
                          ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RDI + 0x5e))
        ;
        sVar4 = (**(code **)(*in_RDI + 0x10))();
        if (sVar3 != sVar4) {
          this_00 = (E *)__cxa_allocate_exception(0x28);
          E::E(this_00,in_stack_ffffffffffffffa8);
          __cxa_throw(this_00,&E::typeinfo,E::~E);
        }
        local_28 = 0;
        while( true ) {
          arg = (char *)(ulong)local_28;
          pcVar5 = (char *)(**(code **)(*in_RDI + 0x10))();
          if (arg == pcVar5) break;
          ppRVar6 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::operator[]
                              ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)
                               (in_RDI + 0x5e),(ulong)local_28);
          if (*ppRVar6 == (value_type)0x0) {
            uVar7 = __cxa_allocate_exception(0x28);
            E::E(in_stack_ffffffffffffffb0,arg);
            __cxa_throw(uVar7,&E::typeinfo,E::~E);
          }
          local_28 = local_28 + 1;
        }
        pDVar8 = TOIDecPOMDPDiscrete::GetIndividualDecPOMDPD
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        lVar9 = (**(code **)(*(long *)&(pDVar8->super_MultiAgentDecisionProcessDiscrete).
                                       super_MultiAgentDecisionProcess + 0x30))();
        local_34 = 0;
        while( true ) {
          uVar10 = (ulong)local_34;
          uVar11 = (**(code **)(*in_RDI + 0x10))();
          if (uVar10 == uVar11) break;
          pDVar8 = TOIDecPOMDPDiscrete::GetIndividualDecPOMDPD
                             (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          lVar12 = (**(code **)(*(long *)&(pDVar8->super_MultiAgentDecisionProcessDiscrete).
                                          super_MultiAgentDecisionProcess + 0x30))();
          if (lVar12 != lVar9) {
            uVar7 = __cxa_allocate_exception(0x28);
            E::E(in_stack_ffffffffffffffb0,arg);
            __cxa_throw(uVar7,&E::typeinfo,E::~E);
          }
          local_34 = local_34 + 1;
        }
      }
      for (local_38 = 0; local_38 != 2; local_38 = local_38 + 1) {
        pMVar13 = TransitionObservationIndependentMADPDiscrete::GetIndividualMADPD
                            (&in_stack_ffffffffffffff80->
                              super_TransitionObservationIndependentMADPDiscrete,
                             in_stack_ffffffffffffff7c);
        in_stack_ffffffffffffff80 =
             (TOIDecPOMDPDiscrete *)
             (**(code **)(*(long *)&pMVar13->super_MultiAgentDecisionProcess + 0x30))();
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (in_RDI + 0x58),(ulong)local_38);
        *pvVar14 = (value_type)in_stack_ffffffffffffff80;
        pMVar13 = TransitionObservationIndependentMADPDiscrete::GetIndividualMADPD
                            (&in_stack_ffffffffffffff80->
                              super_TransitionObservationIndependentMADPDiscrete,
                             in_stack_ffffffffffffff7c);
        vVar15 = (**(code **)(*(long *)&pMVar13->super_MultiAgentDecisionProcess + 0x70))();
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (in_RDI + 0x5b),(ulong)local_38);
        *pvVar14 = vVar15;
      }
      *(byte *)(in_RDI + 0x57) = bVar1;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool TOICompactRewardDecPOMDPDiscrete::SetInitialized(bool b)
{
    if(b == false)
    {
        _m_initialized = false;
        return(true);
    }

    if( TOIDecPOMDPDiscrete::SetInitialized(true))
    {
        if( b == true )
        {
            if (_m_p_rModels.size()!=GetNrAgents())
                throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward models specified yet!");
                
            for(unsigned int i=0;i!=GetNrAgents();++i)
                if (_m_p_rModels[i] == 0)
                    throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward model specified yet! ( _m_p_rModels[i] == 0 )");

            size_t nrStates=GetIndividualDecPOMDPD(0)->GetNrStates();
            for(unsigned int i=0;i!=GetNrAgents();++i)
                if(GetIndividualDecPOMDPD(i)->GetNrStates()!=nrStates)
                    throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : all agents are required to have the same state space (same number of individual states)");
        }

        for(Index i=0;i!=2;++i)
        {
            _m_nrTwoAgentStates[i]=GetIndividualMADPD(i)->GetNrStates();
            _m_nrTwoAgentActions[i]=GetIndividualMADPD(i)->GetNrJointActions();
        }

        _m_initialized = b;
        return(true);
    }
    else
        return(false);
}